

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O3

long __thiscall
njoy::ENDFtk::section::Type<32,_151>::
CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
::NC(CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
     *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_40;
  
  lVar3 = 3;
  if ((this->dap_).
      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
      ._M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
      .
      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
      ._M_engaged == true) {
    lVar3 = (((long)*(pointer *)
                     ((long)&(this->dap_).
                             super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                             ._M_payload.
                             super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
                             .
                             super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                             ._M_payload._M_value.super_ListRecord + 0x38) -
              *(long *)((long)&(this->dap_).
                               super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
                               ._M_payload.
                               super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
                               .
                               super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
                               ._M_payload + 0x30) >> 3) + 5) / 6 + 4;
  }
  pdVar1 = (this->uncertainties_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (this->uncertainties_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  CompactCorrelationMatrix::compact(&local_40,&this->matrix_);
  std::
  vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~vector(&local_40);
  return lVar3 + (((long)pdVar1 - (long)pdVar2 >> 3) + 5) / 6 +
         ((long)local_40.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_40.
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
}

Assistant:

long NC() const {

  long NC = 1;
  if ( this->ISR() ) { NC += Derived::NC( this->dap_.value() ); }
  NC += this->uncertainties_.NC();
  NC += this->matrix_.NC();
  return NC;
}